

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.cc
# Opt level: O2

void __thiscall Tiles::initoptab(Tiles *this)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  bool bVar7;
  
  piVar6 = this->optab[0].ops;
  uVar2 = 0;
  do {
    if (uVar2 == 0x10) {
      return;
    }
    bVar7 = 3 < uVar2;
    uVar1 = (uint)uVar2;
    if (bVar7) {
      *piVar6 = uVar1 - 4;
    }
    uVar4 = (uint)bVar7;
    if ((uVar2 & 3) == 0) {
LAB_0010154d:
      uVar3 = uVar4 + 1;
      ((anon_struct_20_2_fa2531a9 *)(piVar6 + -1))->n = uVar3;
      piVar6[uVar4] = uVar1 + 1;
    }
    else {
      uVar3 = bVar7 + 1;
      ((anon_struct_20_2_fa2531a9 *)(piVar6 + -1))->n = uVar3;
      piVar6[bVar7] = uVar1 - 1;
      uVar4 = uVar3;
      if ((uVar1 & 3) != 3) goto LAB_0010154d;
    }
    if (uVar2 < 0xc) {
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      ((anon_struct_20_2_fa2531a9 *)(piVar6 + -1))->n = uVar3;
      piVar6[uVar5] = uVar1 + 4;
    }
    uVar2 = uVar2 + 1;
    piVar6 = piVar6 + 5;
    if (4 < uVar3) {
      __assert_fail("optab[i].n <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/tiles.cc"
                    ,0x54,"void Tiles::initoptab()");
    }
  } while( true );
}

Assistant:

void Tiles::initoptab() {
	for (int i = 0; i < Ntiles; i++) {
		optab[i].n = 0;
		if (i >= Width)
			optab[i].ops[optab[i].n++] =  i - Width;
		if (i % Width > 0)
			optab[i].ops[optab[i].n++] =  i - 1;
		if (i % Width < Width - 1)
			optab[i].ops[optab[i].n++] =  i + 1;
		if (i < Ntiles - Width)
			optab[i].ops[optab[i].n++] =  i + Width;
		assert (optab[i].n <= 4);
	}
}